

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O2

void inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  uInt uVar7;
  uint uVar8;
  internal_state *piVar9;
  Bytef *pBVar10;
  long lVar11;
  ulg uVar12;
  Posf *pPVar13;
  ulg uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  Bytef *pBVar25;
  Bytef *pBVar26;
  byte *pbVar27;
  ulong uVar28;
  long lVar29;
  byte *local_80;
  int local_48;
  
  piVar9 = strm->state;
  local_80 = strm->next_in;
  pbVar27 = local_80 + (strm->avail_in - 5);
  pBVar10 = strm->next_out;
  uVar7 = strm->avail_out;
  local_48 = (int)pBVar10 - (start - uVar7);
  iVar17 = *(int *)((long)&piVar9->gzhead + 4);
  uVar14 = piVar9->gzindex;
  uVar8 = *(uint *)((long)&piVar9->gzindex + 4);
  bVar2 = *(byte *)&piVar9->head;
  lVar11 = *(long *)&piVar9->method;
  uVar24._0_4_ = piVar9->w_size;
  uVar24._4_4_ = piVar9->w_bits;
  bVar3 = *(byte *)((long)&piVar9->head + 4);
  uVar15 = piVar9->w_mask;
  uVar12 = piVar9->window_size;
  pPVar13 = piVar9->prev;
  pBVar25 = pBVar10;
LAB_0011985b:
  if (uVar15 < 0xf) {
    bVar4 = *local_80;
    pbVar1 = local_80 + 1;
    local_80 = local_80 + 2;
    uVar24 = ((ulong)*pbVar1 << ((byte)uVar15 + 8 & 0x3f)) +
             ((ulong)bVar4 << ((byte)uVar15 & 0x3f)) + uVar24;
    uVar15 = uVar15 | 0x10;
  }
  uVar22 = (ulong)((uint)uVar24 & ~(-1 << (bVar2 & 0x1f)));
  while( true ) {
    bVar4 = *(byte *)(uVar12 + 1 + uVar22 * 4);
    uVar24 = uVar24 >> (bVar4 & 0x3f);
    bVar5 = *(byte *)(uVar12 + uVar22 * 4);
    uVar15 = uVar15 - bVar4;
    uVar6 = *(ushort *)(uVar12 + 2 + uVar22 * 4);
    uVar22 = (ulong)uVar6;
    if (bVar5 == 0) break;
    if ((bVar5 & 0x10) != 0) {
      uVar19 = bVar5 & 0xf;
      if ((bVar5 & 0xf) != 0) {
        if (uVar15 < uVar19) {
          bVar4 = *local_80;
          local_80 = local_80 + 1;
          uVar24 = uVar24 + ((ulong)bVar4 << ((byte)uVar15 & 0x3f));
          uVar15 = uVar15 + 8;
        }
        uVar16 = (uint)uVar24;
        uVar24 = uVar24 >> (sbyte)uVar19;
        uVar15 = uVar15 - uVar19;
        uVar22 = (ulong)((~(-1 << (sbyte)uVar19) & uVar16) + (uint)uVar6);
      }
      if (uVar15 < 0xf) {
        bVar4 = *local_80;
        pbVar1 = local_80 + 1;
        local_80 = local_80 + 2;
        uVar24 = ((ulong)*pbVar1 << ((byte)uVar15 + 8 & 0x3f)) +
                 ((ulong)bVar4 << ((byte)uVar15 & 0x3f)) + uVar24;
        uVar15 = uVar15 | 0x10;
      }
      uVar28 = (ulong)((uint)uVar24 & ~(-1 << (bVar3 & 0x1f)));
      goto LAB_00119976;
    }
    if ((bVar5 & 0x40) != 0) {
      iVar17 = 0x3f3f;
      if ((bVar5 & 0x20) != 0) goto LAB_00119ca7;
      pcVar18 = "invalid literal/length code";
      goto LAB_00119c97;
    }
    uVar22 = (~(-1 << (bVar5 & 0x1f)) & (uint)uVar24) + uVar22;
  }
  *pBVar25 = (Bytef)uVar6;
  pBVar26 = pBVar25 + 1;
  goto LAB_001198d9;
LAB_00119976:
  bVar4 = *(byte *)((long)pPVar13 + uVar28 * 4 + 1);
  uVar24 = uVar24 >> (bVar4 & 0x3f);
  bVar5 = (byte)pPVar13[uVar28 * 2];
  uVar15 = uVar15 - bVar4;
  if ((bVar5 & 0x10) != 0) goto LAB_001199b1;
  if ((bVar5 & 0x40) != 0) {
    pcVar18 = "invalid distance code";
    goto LAB_00119c97;
  }
  uVar28 = (ulong)(~(-1 << (bVar5 & 0x1f)) & (uint)uVar24) + (ulong)pPVar13[uVar28 * 2 + 1];
  goto LAB_00119976;
LAB_001199b1:
  uVar19 = bVar5 & 0xf;
  if (uVar15 < uVar19) {
    uVar24 = ((ulong)*local_80 << ((byte)uVar15 & 0x3f)) + uVar24;
    uVar16 = uVar15 + 8;
    if (uVar16 < uVar19) {
      pbVar1 = local_80 + 1;
      local_80 = local_80 + 2;
      uVar24 = uVar24 + ((ulong)*pbVar1 << ((byte)uVar16 & 0x3f));
      uVar15 = uVar15 + 0x10;
    }
    else {
      local_80 = local_80 + 1;
      uVar15 = uVar16;
    }
  }
  uVar20 = (~(-1 << (sbyte)uVar19) & (uint)uVar24) + (uint)pPVar13[uVar28 * 2 + 1];
  uVar24 = uVar24 >> (sbyte)uVar19;
  uVar15 = uVar15 - uVar19;
  uVar16 = (int)pBVar25 - local_48;
  uVar28 = (ulong)uVar20;
  uVar21 = uVar20 - uVar16;
  uVar19 = (uint)uVar22;
  if (uVar20 < uVar16 || uVar21 == 0) {
    lVar23 = 0;
    do {
      lVar29 = lVar23;
      pBVar25[lVar29] = pBVar25[lVar29 - uVar28];
      pBVar25[lVar29 + 1] = pBVar25[lVar29 + (1 - uVar28)];
      pBVar25[lVar29 + 2] = pBVar25[lVar29 + (2 - uVar28)];
      uVar16 = (int)uVar22 - 3;
      uVar22 = (ulong)uVar16;
      lVar23 = lVar29 + 3;
    } while (2 < uVar16);
    if ((uint)lVar23 == uVar19) {
      pBVar26 = pBVar25 + lVar23;
    }
    else {
      pBVar25[lVar23] = pBVar25[lVar23 + -uVar28];
      if ((uint)lVar23 - uVar19 == -2) {
        pBVar26 = pBVar25 + lVar29 + 5;
        pBVar25[lVar29 + 4] = pBVar25[-uVar28 + 1 + lVar23];
      }
      else {
        pBVar26 = pBVar25 + lVar29 + 4;
      }
    }
    goto LAB_001198d9;
  }
  if (((uint)uVar14 < uVar21) && (piVar9[1].dyn_ltree[0xf5] != (ct_data_s)0x0)) {
    pcVar18 = "invalid distance too far back";
LAB_00119c97:
    strm->msg = pcVar18;
    iVar17 = 0x3f51;
LAB_00119ca7:
    piVar9->status = iVar17;
    pBVar26 = pBVar25;
LAB_00119cab:
    strm->next_in = local_80 + -(ulong)(uVar15 >> 3);
    strm->next_out = pBVar26;
    strm->avail_in = ((int)pbVar27 - (int)(local_80 + -(ulong)(uVar15 >> 3))) + 5;
    uVar24 = (ulong)((uint)uVar24 & ~(-1 << (sbyte)(uVar15 & 7)));
    strm->avail_out = ((int)(pBVar10 + (uVar7 - 0x101)) - (int)pBVar26) + 0x101;
    piVar9->w_size = (int)uVar24;
    piVar9->w_bits = (int)(uVar24 >> 0x20);
    piVar9->w_mask = uVar15 & 7;
    return;
  }
  if (uVar8 == 0) {
    lVar23 = (ulong)(iVar17 - uVar21) + lVar11;
    uVar16 = uVar19 - uVar21;
    if (uVar21 <= uVar19 && uVar16 != 0) {
      lVar29 = 0;
      do {
        *pBVar25 = *(Bytef *)(lVar23 + lVar29);
        pBVar25 = pBVar25 + 1;
        lVar29 = lVar29 + 1;
      } while (uVar21 != (uint)lVar29);
LAB_00119ba1:
      lVar23 = (long)pBVar25 - uVar28;
      uVar19 = uVar16;
    }
  }
  else if (uVar8 < uVar21) {
    lVar23 = (ulong)((uVar8 + iVar17) - uVar21) + lVar11;
    uVar21 = uVar21 - uVar8;
    uVar16 = uVar19 - uVar21;
    if (uVar21 <= uVar19 && uVar16 != 0) {
      lVar29 = 0;
      do {
        pBVar25[lVar29] = *(Bytef *)(lVar23 + lVar29);
        lVar29 = lVar29 + 1;
      } while (uVar21 != (uint)lVar29);
      pBVar25 = pBVar25 + lVar29;
      lVar23 = lVar11;
      uVar19 = uVar16;
      if (uVar8 < uVar16) {
        lVar23 = 0;
        do {
          *pBVar25 = *(Bytef *)(lVar11 + lVar23);
          pBVar25 = pBVar25 + 1;
          lVar23 = lVar23 + 1;
        } while (uVar8 != (uint)lVar23);
        lVar23 = (long)pBVar25 - uVar28;
        uVar19 = uVar16 - uVar8;
      }
    }
  }
  else {
    lVar23 = (ulong)(uVar8 - uVar21) + lVar11;
    uVar16 = uVar19 - uVar21;
    if (uVar21 <= uVar19 && uVar16 != 0) {
      lVar29 = 0;
      do {
        *pBVar25 = *(Bytef *)(lVar23 + lVar29);
        pBVar25 = pBVar25 + 1;
        lVar29 = lVar29 + 1;
      } while (uVar21 != (uint)lVar29);
      goto LAB_00119ba1;
    }
  }
  lVar29 = 0;
  for (uVar16 = uVar19; 2 < uVar16; uVar16 = uVar16 - 3) {
    pBVar25[lVar29] = *(Bytef *)(lVar23 + lVar29);
    pBVar25[lVar29 + 1] = *(Bytef *)(lVar23 + 1 + lVar29);
    pBVar25[lVar29 + 2] = *(Bytef *)(lVar23 + 2 + lVar29);
    lVar29 = lVar29 + 3;
  }
  if ((uint)lVar29 == uVar19) {
    pBVar26 = pBVar25 + lVar29;
  }
  else {
    pBVar25[lVar29] = *(Bytef *)(lVar23 + lVar29);
    if ((uint)lVar29 - uVar19 == -2) {
      pBVar26 = pBVar25 + lVar29 + 2;
      pBVar25[lVar29 + 1] = *(Bytef *)(lVar23 + 1 + lVar29);
    }
    else {
      pBVar26 = pBVar25 + lVar29 + 1;
    }
  }
LAB_001198d9:
  if ((pbVar27 <= local_80) || (pBVar25 = pBVar26, pBVar10 + (uVar7 - 0x101) <= pBVar26))
  goto LAB_00119cab;
  goto LAB_0011985b;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    z_const unsigned char FAR *in;      /* local strm->next_in */
    z_const unsigned char FAR *last;    /* have enough input while in < last */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code here;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in;
    last = in + (strm->avail_in - 5);
    out = strm->next_out;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
        }
        here = lcode[hold & lmask];
      dolen:
        op = (unsigned)(here.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here.val));
            *out++ = (unsigned char)(here.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
            }
            here = dcode[hold & dmask];
          dodist:
            op = (unsigned)(here.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(*in++) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                *out++ = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            *out++ = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                *out++ = *from++;
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = window;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    *out++ = *from++;
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    }
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode[here.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode[here.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in;
    strm->next_out = out;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}